

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cArrayOfArraysTests.cpp
# Opt level: O1

void __thiscall
glcts::ArraysOfArrays::SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES>::
test_shader_compilation
          (SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *this,
          TestShaderType tested_shader_type)

{
  ulong uVar1;
  long *plVar2;
  ulong *puVar3;
  TestError *pTVar4;
  long lVar5;
  long lVar6;
  long *plVar7;
  string *psVar8;
  undefined1 *puVar9;
  ulong uVar10;
  ulong uVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string base_variable_string;
  string base_var_type;
  string shader_source;
  ulong local_110;
  long *local_108;
  long local_f8;
  long lStack_f0;
  long *local_e8 [2];
  long local_d8 [2];
  long *local_c8;
  long local_c0;
  long local_b8;
  long lStack_b0;
  long *local_a8 [2];
  long local_98 [2];
  long *local_88;
  long local_80;
  long local_78 [2];
  long *local_68 [2];
  long local_58 [2];
  long local_48;
  long local_40;
  SizedDeclarationsPrimitive<glcts::ArraysOfArrays::Interface::ES> *local_38;
  
  local_48 = 0;
  local_38 = this;
  do {
    lVar5 = 0x2238c78;
    if (supported_variable_types_map._16_8_ != 0) {
      lVar5 = 0x2238c78;
      lVar6 = supported_variable_types_map._16_8_;
      do {
        if (*(int *)(Interface::ES::var_types + local_48 * 4) <= *(int *)(lVar6 + 0x20)) {
          lVar5 = lVar6;
        }
        lVar6 = *(long *)(lVar6 + 0x10 +
                         (ulong)(*(int *)(lVar6 + 0x20) <
                                *(int *)(Interface::ES::var_types + local_48 * 4)) * 8);
      } while (lVar6 != 0);
    }
    lVar6 = 0x2238c78;
    if ((lVar5 != 0x2238c78) &&
       (lVar6 = lVar5, *(int *)(Interface::ES::var_types + local_48 * 4) < *(int *)(lVar5 + 0x20)))
    {
      lVar6 = 0x2238c78;
    }
    if (lVar6 == 0x2238c78) {
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,"Type not found.",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                 ,0x529);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    uVar10 = 2;
    local_110 = 3;
    local_40 = lVar6;
    do {
      local_88 = local_78;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,*(long *)(lVar6 + 0x28),
                 *(long *)(lVar6 + 0x30) + *(long *)(lVar6 + 0x28));
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_a8,local_88,local_80 + (long)local_88);
      uVar11 = 0;
      do {
        local_68[0] = local_58;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_68,0x1b3c1e9);
        local_e8[0] = local_d8;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_e8,shader_start_abi_cxx11_,DAT_02233658 + shader_start_abi_cxx11_
                  );
        std::__cxx11::string::append((char *)local_e8);
        plVar2 = (long *)std::__cxx11::string::_M_append((char *)local_e8,(ulong)local_a8[0]);
        local_c8 = &local_b8;
        plVar7 = plVar2 + 2;
        if ((long *)*plVar2 == plVar7) {
          local_b8 = *plVar7;
          lStack_b0 = plVar2[3];
        }
        else {
          local_b8 = *plVar7;
          local_c8 = (long *)*plVar2;
        }
        local_c0 = plVar2[1];
        *plVar2 = (long)plVar7;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        plVar2 = (long *)std::__cxx11::string::append((char *)&local_c8);
        local_108 = &local_f8;
        plVar7 = plVar2 + 2;
        if ((long *)*plVar2 == plVar7) {
          local_f8 = *plVar7;
          lStack_f0 = plVar2[3];
        }
        else {
          local_f8 = *plVar7;
          local_108 = (long *)*plVar2;
        }
        *plVar2 = (long)plVar7;
        plVar2[1] = 0;
        *(undefined1 *)(plVar2 + 2) = 0;
        std::__cxx11::string::_M_append((char *)local_68,(ulong)local_108);
        if (local_108 != &local_f8) {
          operator_delete(local_108,local_f8 + 1);
        }
        if (local_c8 != &local_b8) {
          operator_delete(local_c8,local_b8 + 1);
        }
        uVar1 = uVar11;
        if (local_e8[0] != local_d8) {
          operator_delete(local_e8[0],local_d8[0] + 1);
        }
        for (; uVar1 < uVar10; uVar1 = uVar1 + 1) {
          std::__cxx11::string::append((char *)local_68);
        }
        std::__cxx11::string::append((char *)local_68);
        puVar3 = &set_tesseation_abi_cxx11_;
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
        case COMPUTE_SHADER_TYPE:
        case TESSELATION_EVALUATION_SHADER_TYPE:
          break;
        case VERTEX_SHADER_TYPE:
          std::__cxx11::string::append((char *)local_68);
          break;
        case GEOMETRY_SHADER_TYPE:
          puVar3 = &emit_quad_abi_cxx11_;
        case TESSELATION_CONTROL_SHADER_TYPE:
          std::__cxx11::string::_M_append((char *)local_68,*puVar3);
          break;
        default:
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Unrecognized shader type.",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x51d);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        std::__cxx11::string::_M_append((char *)local_68,shader_end_abi_cxx11_);
        puVar9 = empty_string_abi_cxx11_;
        psVar8 = (string *)empty_string_abi_cxx11_;
        switch(tested_shader_type) {
        case FRAGMENT_SHADER_TYPE:
          puVar9 = default_vertex_shader_source_abi_cxx11_;
          psVar8 = (string *)local_68;
          break;
        case VERTEX_SHADER_TYPE:
          puVar9 = (string *)local_68;
          goto LAB_00b33519;
        case COMPUTE_SHADER_TYPE:
          break;
        case GEOMETRY_SHADER_TYPE:
        case TESSELATION_CONTROL_SHADER_TYPE:
        case TESSELATION_EVALUATION_SHADER_TYPE:
          puVar9 = default_vertex_shader_source_abi_cxx11_;
LAB_00b33519:
          psVar8 = (string *)default_fragment_shader_source_abi_cxx11_;
          break;
        default:
          pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
          tcu::TestError::TestError
                    (pTVar4,"Invalid enum",(char *)0x0,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gles31/es31cArrayOfArraysTests.cpp"
                     ,0x520);
          __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
        }
        (*(local_38->super_TestCaseBase<glcts::ArraysOfArrays::Interface::ES>).super_TestCase.
          super_TestNode._vptr_TestNode[9])(local_38,puVar9,psVar8,1,0);
        std::__cxx11::string::append((char *)local_a8);
        if (local_68[0] != local_58) {
          operator_delete(local_68[0],local_58[0] + 1);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_110);
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0],local_98[0] + 1);
      }
      lVar6 = local_40;
      if (local_88 != local_78) {
        operator_delete(local_88,local_78[0] + 1);
      }
      uVar10 = uVar10 + 1;
      local_110 = local_110 + 1;
    } while (local_110 != 10);
    local_48 = local_48 + 1;
    if (local_48 == 0x1c) {
      return;
    }
  } while( true );
}

Assistant:

void SizedDeclarationsPrimitive<API>::test_shader_compilation(
	typename TestCaseBase<API>::TestShaderType tested_shader_type)
{
	for (size_t var_type_index = 0; var_type_index < API::n_var_types; var_type_index++)
	{
		_supported_variable_types_map_const_iterator var_iterator =
			supported_variable_types_map.find(API::var_types[var_type_index]);

		if (var_iterator != supported_variable_types_map.end())
		{
			/* Loop round for each var_types ("int", "uint", "float", etc.)
			 * We are testing a[][] to a [][][][][][][][], so start counter at 2. */
			for (size_t max_dimension_limit = 2; max_dimension_limit <= API::MAX_ARRAY_DIMENSIONS;
				 max_dimension_limit++)
			{
				// Record the base varTypeModifier + varType
				std::string base_var_type		 = var_iterator->second.type;
				std::string base_variable_string = base_var_type;

				for (size_t base_sub_script_index = 0; base_sub_script_index <= max_dimension_limit;
					 base_sub_script_index++)
				{
					std::string shader_source = "";

					// Add the shader body start, and the base varTypeModifier + varType + variable name.
					shader_source += shader_start + "    " + base_variable_string + " a";

					for (size_t remaining_sub_script_index = base_sub_script_index;
						 remaining_sub_script_index < max_dimension_limit; remaining_sub_script_index++)
					{
						/* Add as many array sub_scripts as we can, up to the current dimension limit. */
						shader_source += "[2]";
					}

					/* End line */
					shader_source += ";\n";

					/* End main */
					DEFAULT_MAIN_ENDING(tested_shader_type, shader_source);

					/* Execute test */
					EXECUTE_POSITIVE_TEST(tested_shader_type, shader_source, true, false);

					/* From now on, we'll have an extra sub_script each time. */
					base_variable_string += "[2]";
				} /* for (int base_sub_script_index = 0; ...) */
			}	 /* for (int max_dimension_limit = 2; ...) */
		}		  /* if var_type iterator found */
		else
		{
			TCU_FAIL("Type not found.");
		}
	} /* for (int var_type_index = 0; ...) */
}